

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::TypeofElem_UInt32
              (Var instance,uint32 index,ScriptContext *scriptContext)

{
  BOOL BVar1;
  JavascriptLibrary *this;
  Var index_00;
  ScriptContext *scriptContext_local;
  uint32 index_local;
  Var instance_local;
  
  BVar1 = IsNumberFromNativeArray(instance,index,scriptContext);
  if (BVar1 == 0) {
    index_00 = JavascriptNumber::ToVar(index,scriptContext);
    instance_local = TypeofElem(instance,index_00,scriptContext);
  }
  else {
    this = ScriptContext::GetLibrary(scriptContext);
    instance_local = JavascriptLibrary::GetNumberTypeDisplayString(this);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::TypeofElem_UInt32(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofElem_UInt32);
        if (JavascriptOperators::IsNumberFromNativeArray(instance, index, scriptContext))
            return scriptContext->GetLibrary()->GetNumberTypeDisplayString();

#if FLOATVAR
        return TypeofElem(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return TypeofElem(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_TypeofElem_UInt32);
    }